

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

Abc_Obj_t * Abc_NtkCreateNodeOr(Abc_Ntk_t *pNtk,Vec_Ptr_t *vFanins)

{
  Abc_NtkFunc_t AVar1;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar2;
  DdNode *n;
  int nVars;
  long lVar3;
  
  if (1 < pNtk->ntkType - ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x305,"Abc_Obj_t *Abc_NtkCreateNodeOr(Abc_Ntk_t *, Vec_Ptr_t *)");
  }
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  nVars = vFanins->nSize;
  if (0 < nVars) {
    lVar3 = 0;
    do {
      Abc_ObjAddFanin(pObj,(Abc_Obj_t *)vFanins->pArray[lVar3]);
      lVar3 = lVar3 + 1;
      nVars = vFanins->nSize;
    } while (lVar3 < nVars);
  }
  AVar1 = pNtk->ntkFunc;
  if (AVar1 == ABC_FUNC_AIG) {
    pHVar2 = Hop_CreateOr((Hop_Man_t *)pNtk->pManFunc,nVars);
  }
  else {
    if (AVar1 == ABC_FUNC_BDD) {
      n = Extra_bddCreateOr((DdManager *)pNtk->pManFunc,nVars);
      (pObj->field_5).pData = n;
      Cudd_Ref(n);
      return pObj;
    }
    if (AVar1 != ABC_FUNC_SOP) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                    ,0x312,"Abc_Obj_t *Abc_NtkCreateNodeOr(Abc_Ntk_t *, Vec_Ptr_t *)");
    }
    pHVar2 = (Hop_Obj_t *)Abc_SopCreateOr((Mem_Flex_t *)pNtk->pManFunc,nVars,(int *)0x0);
  }
  (pObj->field_5).pData = pHVar2;
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkCreateNodeOr( Abc_Ntk_t * pNtk, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsLogic(pNtk) || Abc_NtkIsNetlist(pNtk) );
    pNode = Abc_NtkCreateNode( pNtk );   
    for ( i = 0; i < vFanins->nSize; i++ )
        Abc_ObjAddFanin( pNode, (Abc_Obj_t *)vFanins->pArray[i] );
    if ( Abc_NtkHasSop(pNtk) )
        pNode->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNtk->pManFunc, Vec_PtrSize(vFanins), NULL );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        pNode->pData = Extra_bddCreateOr( (DdManager *)pNtk->pManFunc, Vec_PtrSize(vFanins) ), Cudd_Ref((DdNode *)pNode->pData); 
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        pNode->pData = Hop_CreateOr( (Hop_Man_t *)pNtk->pManFunc, Vec_PtrSize(vFanins) ); 
    else
        assert( 0 );
    return pNode;
}